

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>(basic_appender<char> out,char value)

{
  basic_appender<char> bVar1;
  basic_appender<char> local_18;
  
  bVar1 = reserve<char>(out,1);
  local_18 = bVar1;
  basic_appender<char>::operator=(&local_18,value);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value) -> OutputIt {
  auto it = reserve(out, 1);
  *it++ = value;
  return base_iterator(out, it);
}